

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O0

void __thiscall QWidgetLineControl::emitCursorPositionChanged(QWidgetLineControl *this)

{
  bool bVar1;
  QWidgetLineControl *in_RDI;
  long in_FS_OFFSET;
  int oldLast;
  QAccessibleTextCursorEvent event;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int cursorPos;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar2;
  QWidgetLineControl *this_00;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->m_cursor != in_RDI->m_lastCursorPos) {
    iVar2 = in_RDI->m_lastCursorPos;
    in_RDI->m_lastCursorPos = in_RDI->m_cursor;
    this_00 = in_RDI;
    cursorPositionChanged
              ((QWidgetLineControl *)0x5dc6ff,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    bVar1 = hasSelectedText(in_RDI);
    cursorPos = (int)((ulong)in_RDI >> 0x20);
    if (!bVar1) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      accessibleObject((QWidgetLineControl *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      QAccessibleTextCursorEvent::QAccessibleTextCursorEvent
                ((QAccessibleTextCursorEvent *)this_00,
                 (QObject *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),cursorPos);
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_28);
      QAccessibleTextCursorEvent::~QAccessibleTextCursorEvent
                ((QAccessibleTextCursorEvent *)&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetLineControl::emitCursorPositionChanged()
{
    if (m_cursor != m_lastCursorPos) {
        const int oldLast = m_lastCursorPos;
        m_lastCursorPos = m_cursor;
        emit cursorPositionChanged(oldLast, m_cursor);
#if QT_CONFIG(accessibility)
        // otherwise we send a selection update which includes the cursor
        if (!hasSelectedText()) {
            QAccessibleTextCursorEvent event(accessibleObject(), m_cursor);
            QAccessible::updateAccessibility(&event);
        }
#endif
    }
}